

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  int local_50;
  int local_4c;
  int i_1;
  int i;
  int x;
  int m;
  int n;
  undefined1 local_30 [8];
  Tree t2;
  Tree t1;
  
  Tree::Tree((Tree *)&t2.mSize);
  Tree::Tree((Tree *)local_30);
  std::istream::operator>>((istream *)&std::cin,&x);
  for (local_4c = 0; local_4c < x; local_4c = local_4c + 1) {
    std::istream::operator>>((istream *)&std::cin,&i_1);
    Tree::insert((Tree *)&t2.mSize,i_1);
  }
  std::istream::operator>>((istream *)&std::cin,&i);
  for (local_50 = 0; local_50 < i; local_50 = local_50 + 1) {
    std::istream::operator>>((istream *)&std::cin,&i_1);
    Tree::insert((Tree *)local_30,i_1);
  }
  bVar1 = Tree::isSameBinaryTree((Tree *)&t2.mSize,(Tree *)local_30);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"True");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"False");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  Tree::~Tree((Tree *)local_30);
  Tree::~Tree((Tree *)&t2.mSize);
  return 0;
}

Assistant:

int main()
{
    Tree t1;
    Tree t2;
    int n, m, x;
    cin>>n;
    for (int i = 0; i < n; i++) {
        cin>>x;
        t1.insert(x);
    }
    cin>>m;
    for (int i = 0; i < m; i++) {
        cin>>x;
        t2.insert(x);
    }
    if (t1.isSameBinaryTree(t2)) {
        cout<<"True"<<endl;
    } else {
        cout<<"False"<<endl;
    }
    return 0;
}